

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GenKeyCompare
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *pIVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (struct_def->has_key == false) {
    __assert_fail("struct_def.has_key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                  ,0x3a6,
                  "void flatbuffers::go::GoGenerator::GenKeyCompare(const StructDef &, const FieldDef &, std::string *)"
                 );
  }
  if (field->key != false) {
    pIVar1 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_50,pIVar1,struct_def);
    std::operator+(&local_90,"func ",&local_50);
    std::operator+(&local_70,&local_90,"KeyCompare(");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)code_ptr);
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_50,pIVar1,struct_def);
    std::operator+(&local_90,"\tobj1 := &",&local_50);
    std::operator+(&local_70,&local_90,"{}\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_50,pIVar1,struct_def);
    std::operator+(&local_90,"\tobj2 := &",&local_50);
    std::operator+(&local_70,&local_90,"{}\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    if ((field->value).type.base_type == BASE_TYPE_STRING) {
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (&local_50,pIVar1,field,(ulong)(this->namer_).super_Namer.config_.functions);
      std::operator+(&local_90,"\treturn string(obj1.",&local_50);
      std::operator+(&local_70,&local_90,"()) < ");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (&local_50,pIVar1,field,(ulong)(this->namer_).super_Namer.config_.functions);
      std::operator+(&local_90,"string(obj2.",&local_50);
      std::operator+(&local_70,&local_90,"())\n");
      std::__cxx11::string::append((string *)code_ptr);
    }
    else {
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (&local_50,pIVar1,field,(ulong)(this->namer_).super_Namer.config_.functions);
      std::operator+(&local_90,"\treturn obj1.",&local_50);
      std::operator+(&local_70,&local_90,"() < ");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (&local_50,pIVar1,field,(ulong)(this->namer_).super_Namer.config_.functions);
      std::operator+(&local_90,"obj2.",&local_50);
      std::operator+(&local_70,&local_90,"()\n");
      std::__cxx11::string::append((string *)code_ptr);
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)code_ptr);
    return;
  }
  __assert_fail("field.key",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                ,0x3a7,
                "void flatbuffers::go::GoGenerator::GenKeyCompare(const StructDef &, const FieldDef &, std::string *)"
               );
}

Assistant:

void GenKeyCompare(const StructDef &struct_def, const FieldDef &field,
                     std::string *code_ptr) {
    FLATBUFFERS_ASSERT(struct_def.has_key);
    FLATBUFFERS_ASSERT(field.key);
    std::string &code = *code_ptr;

    code += "func " + namer_.Type(struct_def) + "KeyCompare(";
    code += "o1, o2 flatbuffers.UOffsetT, buf []byte) bool {\n";
    code += "\tobj1 := &" + namer_.Type(struct_def) + "{}\n";
    code += "\tobj2 := &" + namer_.Type(struct_def) + "{}\n";
    code += "\tobj1.Init(buf, flatbuffers.UOffsetT(len(buf))-o1)\n";
    code += "\tobj2.Init(buf, flatbuffers.UOffsetT(len(buf))-o2)\n";
    if (IsString(field.value.type)) {
      code += "\treturn string(obj1." + namer_.Function(field.name) + "()) < ";
      code += "string(obj2." + namer_.Function(field.name) + "())\n";
    } else {
      code += "\treturn obj1." + namer_.Function(field.name) + "() < ";
      code += "obj2." + namer_.Function(field.name) + "()\n";
    }
    code += "}\n\n";
  }